

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O2

bool __thiscall Glucose::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  int *piVar1;
  FILE *__s;
  vec<unsigned_int> *pvVar2;
  uint *puVar3;
  uint uVar4;
  bool bVar5;
  CRef CVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int i;
  long lVar13;
  int i_1;
  Clause *this_00;
  
  this_00 = (Clause *)((this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory + cr);
  Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
  if ((this->super_Solver).certifiedUNSAT == true) {
    if ((this->super_Solver).vbyte == false) {
      for (lVar13 = 0; lVar13 < *(int *)&(this_00->header).field_0x4; lVar13 = lVar13 + 1) {
        uVar8 = *(uint *)(&this_00[1].header.field_0x0 + lVar13 * 4);
        if (uVar8 != l.x) {
          uVar4 = ~((int)uVar8 >> 1);
          if ((uVar8 & 1) == 0) {
            uVar4 = ((int)uVar8 >> 1) + 1;
          }
          fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar4);
        }
      }
      fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
    }
    else {
      Solver::write_char(&this->super_Solver,'a');
      for (lVar13 = 0; lVar13 < *(int *)&(this_00->header).field_0x4; lVar13 = lVar13 + 1) {
        iVar9 = *(int *)(&this_00[1].header.field_0x0 + lVar13 * 4);
        if (iVar9 != l.x) {
          Solver::write_lit(&this->super_Solver,iVar9 + 2);
        }
      }
      Solver::write_lit(&this->super_Solver,0);
    }
  }
  if (*(int *)&(this_00->header).field_0x4 == 2) {
    removeClause(this,cr,false);
    Clause::strengthen(this_00,l);
  }
  else {
    if ((this->super_Solver).certifiedUNSAT == true) {
      if ((this->super_Solver).vbyte == true) {
        Solver::write_char(&this->super_Solver,'d');
        for (lVar13 = 0; lVar13 < *(int *)&(this_00->header).field_0x4; lVar13 = lVar13 + 1) {
          Solver::write_lit(&this->super_Solver,
                            *(int *)(&this_00[1].header.field_0x0 + lVar13 * 4) + 2);
        }
        Solver::write_lit(&this->super_Solver,0);
      }
      else {
        fwrite("d ",2,1,(FILE *)(this->super_Solver).certifiedOutput);
        for (lVar13 = 0; __s = (FILE *)(this->super_Solver).certifiedOutput,
            lVar13 < *(int *)&(this_00->header).field_0x4; lVar13 = lVar13 + 1) {
          uVar8 = *(uint *)(&this_00[1].header.field_0x0 + lVar13 * 4);
          uVar7 = (int)uVar8 >> 1;
          uVar4 = ~uVar7;
          if ((uVar8 & 1) == 0) {
            uVar4 = uVar7 + 1;
          }
          fprintf(__s,"%i ",(ulong)uVar4);
        }
        fwrite("0\n",2,1,__s);
      }
    }
    Solver::detachClause(&this->super_Solver,cr,true);
    Clause::strengthen(this_00,l);
    Solver::attachClause(&this->super_Solver,cr);
    iVar9 = l.x >> 1;
    pvVar2 = (this->occurs).occs.data;
    uVar8 = pvVar2[iVar9].sz;
    puVar3 = pvVar2[iVar9].data;
    uVar12 = 0;
    uVar10 = 0;
    if (0 < (int)uVar8) {
      uVar10 = (ulong)uVar8;
    }
    for (; (uVar11 = uVar10, uVar10 != uVar12 && (uVar11 = uVar12, puVar3[uVar12] != cr));
        uVar12 = uVar12 + 1) {
    }
    for (; (long)uVar11 < (long)(int)(uVar8 - 1); uVar11 = uVar11 + 1) {
      puVar3[uVar11] = puVar3[uVar11 + 1];
      uVar8 = pvVar2[iVar9].sz;
    }
    pvVar2[iVar9].sz = uVar8 - 1;
    piVar1 = (this->n_occ).data + l.x;
    *piVar1 = *piVar1 + -1;
    updateElimHeap(this,iVar9);
  }
  bVar5 = true;
  if (((undefined1  [12])this_00->header & (undefined1  [12])0xffffffff00000000) ==
      (undefined1  [12])0x100000000) {
    bVar5 = Solver::enqueue(&this->super_Solver,(Lit)*(int *)&this_00[1].header,0xffffffff);
    if (bVar5) {
      CVar6 = Solver::propagate(&this->super_Solver);
      bVar5 = CVar6 == 0xffffffff;
    }
    else {
      bVar5 = false;
    }
  }
  return bVar5;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) write_lit(2*(var(c[i])+1) + sign(c[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
            if (vbyte) {
                write_char('d');
                for (int i = 0; i < c.size(); i++)
                    write_lit(2*(var(c[i])+1) + sign(c[i]));
                write_lit(0);
            }
            else {
                fprintf(certifiedOutput, "d ");
                for (int i = 0; i < c.size(); i++)
                    fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
                fprintf(certifiedOutput, "0\n");
            }
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}